

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall annealing::print(annealing *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"STEP: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ENERGY: ");
  poVar1 = std::ostream::_M_insert<double>(this->old_energy);
  poVar1 = std::operator<<(poVar1," TEMPERATURE: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->temperature);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print() {
        std::cout << "STEP: " << step_num <<" ENERGY: " << old_energy << " TEMPERATURE: " << temperature << std::endl;
    }